

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_tests.cpp
# Opt level: O3

void i2p_tests::damaged_private_key_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestOpts opts;
  unit_test_log_t *puVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  damaged_private_key t;
  undefined8 in_stack_fffffffffffff918;
  undefined8 in_stack_fffffffffffff920;
  pointer in_stack_fffffffffffff928;
  undefined8 in_stack_fffffffffffff930;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_668;
  char *local_660;
  char *local_658;
  char *local_650;
  undefined1 local_648 [112];
  ios_base local_5d8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  undefined1 local_4b0 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338 [23];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_658 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/i2p_tests.cpp";
  local_650 = "";
  memset((ostringstream *)local_4b0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  local_338[0]._M_string_length = 0;
  local_338[0].field_2._M_local_buf[0] = '\0';
  local_648[0] = 0x22;
  local_338[0]._M_dataplus._M_p = (pointer)&local_338[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,local_648,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_4b0,"damaged_private_key",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b0,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_338,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_648);
  if ((undefined1 *)local_648._0_8_ != local_648 + 0x10) {
    operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
  }
  local_668 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338[0]._M_dataplus._M_p;
  local_660 = local_338[0]._M_dataplus._M_p + local_338[0]._M_string_length;
  file.m_end = (iterator)0x85;
  file.m_begin = (iterator)&local_658;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_668,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338[0]._M_dataplus._M_p != &local_338[0].field_2) {
    operator_delete(local_338[0]._M_dataplus._M_p,
                    CONCAT71(local_338[0].field_2._M_allocated_capacity._1_7_,
                             local_338[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base((ios_base *)(local_4b0 + 0x70));
  local_648._0_8_ = (pointer)0x0;
  local_648._8_8_ = 0;
  local_648._16_8_ = 0;
  local_648._24_4_ = 0x1010101;
  local_648[0x1c] = '\0';
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff920;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff918;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffff928;
  opts.coins_db_in_memory = (bool)(char)in_stack_fffffffffffff930;
  opts.block_tree_db_in_memory = (bool)(char)((ulong)in_stack_fffffffffffff930 >> 8);
  opts.setup_net = (bool)(char)((ulong)in_stack_fffffffffffff930 >> 0x10);
  opts.setup_validation_interface = (bool)(char)((ulong)in_stack_fffffffffffff930 >> 0x18);
  opts.min_validation_cache = (bool)(char)((ulong)in_stack_fffffffffffff930 >> 0x20);
  opts._29_3_ = (int3)((ulong)in_stack_fffffffffffff930 >> 0x28);
  EnvTestingSetup::EnvTestingSetup((EnvTestingSetup *)local_4b0,MAIN,opts);
  if ((pointer)local_648._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_648._0_8_,local_648._16_8_ - local_648._0_8_);
  }
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_678 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/i2p_tests.cpp";
  local_670 = "";
  memset((ostringstream *)local_648,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
  paVar1 = &local_4d0.field_2;
  local_4d0._M_string_length = 0;
  local_4d0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4d0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_648,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_648,"damaged_private_key",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_648,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4d0,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_688 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p;
  local_680 = local_4d0._M_dataplus._M_p + local_4d0._M_string_length;
  file_00.m_end = (iterator)0x85;
  file_00.m_begin = (iterator)&local_678;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_688,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p,
                    CONCAT71(local_4d0.field_2._M_allocated_capacity._1_7_,
                             local_4d0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
  std::ios_base::~ios_base(local_5d8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_698 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/i2p_tests.cpp";
  local_690 = "";
  memset((ostringstream *)local_648,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
  local_4d0._M_string_length = 0;
  local_4d0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4d0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_648,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_648,"damaged_private_key",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_648,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4d0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p;
  local_6a0 = local_4d0._M_dataplus._M_p + local_4d0._M_string_length;
  file_01.m_end = (iterator)0x85;
  file_01.m_begin = (iterator)&local_698;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_6a8,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p,
                    CONCAT71(local_4d0.field_2._M_allocated_capacity._1_7_,
                             local_4d0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
  std::ios_base::~ios_base(local_5d8);
  damaged_private_key::test_method((damaged_private_key *)local_4b0);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/i2p_tests.cpp";
  local_6b0 = "";
  memset((ostringstream *)local_648,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
  local_4d0._M_string_length = 0;
  local_4d0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4d0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_648,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_648,"damaged_private_key",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_648,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4d0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p;
  local_6c0 = local_4d0._M_dataplus._M_p + local_4d0._M_string_length;
  file_02.m_end = (iterator)0x85;
  file_02.m_begin = (iterator)&local_6b8;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_6c8,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p,
                    CONCAT71(local_4d0.field_2._M_allocated_capacity._1_7_,
                             local_4d0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
  std::ios_base::~ios_base(local_5d8);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  memset((ostringstream *)local_648,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_648);
  local_4d0._M_string_length = 0;
  local_4d0.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_4d0._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_648,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_648,"damaged_private_key",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_648,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_4d0,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  file_03.m_end = (iterator)0x85;
  file_03.m_begin = &stack0xfffffffffffff928;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (puVar3,file_03,(size_t)&stack0xfffffffffffff918,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_4d0._M_dataplus._M_p,
                    CONCAT71(local_4d0.field_2._M_allocated_capacity._1_7_,
                             local_4d0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_648);
  std::ios_base::~ios_base(local_5d8);
  EnvTestingSetup::~EnvTestingSetup((EnvTestingSetup *)local_4b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(damaged_private_key)
{
    CreateSock = [](int, int, int) {
        return std::make_unique<StaticContentsSock>("HELLO REPLY RESULT=OK VERSION=3.1\n"
                                                    "SESSION STATUS RESULT=OK DESTINATION=\n");
    };

    const auto i2p_private_key_file = m_args.GetDataDirNet() / "test_i2p_private_key_damaged";

    for (const auto& [file_contents, expected_error] : std::vector<std::tuple<std::string, std::string>>{
             {"", "The private key is too short (0 < 387)"},

             {"abcd", "The private key is too short (4 < 387)"},

             {std::string(386, '\0'), "The private key is too short (386 < 387)"},

             {std::string(385, '\0') + '\0' + '\1',
              "Certificate length (1) designates that the private key should be 388 bytes, but it is only "
              "387 bytes"},

             {std::string(385, '\0') + '\0' + '\5' + "abcd",
              "Certificate length (5) designates that the private key should be 392 bytes, but it is only "
              "391 bytes"}}) {
        BOOST_REQUIRE(WriteBinaryFile(i2p_private_key_file, file_contents));

        CThreadInterrupt interrupt;
        const CService addr{in6_addr(IN6ADDR_LOOPBACK_INIT), /*port=*/7656};
        const Proxy sam_proxy{addr, false};
        i2p::sam::Session session(i2p_private_key_file, sam_proxy, &interrupt);

        {
            ASSERT_DEBUG_LOG("Creating persistent SAM session");
            ASSERT_DEBUG_LOG(expected_error);

            i2p::Connection conn;
            bool proxy_error;
            BOOST_CHECK(!session.Connect(CService{}, conn, proxy_error));
        }
    }
}